

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

Result __thiscall
presolve::HPresolve::removeRowSingletons(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  int iVar1;
  Result RVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  long in_RDI;
  Result __result;
  HighsInt row;
  size_t i;
  HighsInt in_stack_0000087c;
  HighsPostsolveStack *in_stack_00000880;
  HPresolve *in_stack_00000888;
  size_type local_20;
  
  local_20 = 0;
  while( true ) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x598));
    if (local_20 == sVar3) {
      std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x6f7ac1);
      return kOk;
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x598),local_20);
    iVar1 = *pvVar4;
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x5c8),
                        (long)iVar1);
    if (((*pvVar5 == '\0') &&
        (pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x100),(long)iVar1),
        *pvVar4 < 2)) &&
       (RVar2 = rowPresolve(in_stack_00000888,in_stack_00000880,in_stack_0000087c), RVar2 != kOk))
    break;
    local_20 = local_20 + 1;
  }
  return RVar2;
}

Assistant:

HPresolve::Result HPresolve::removeRowSingletons(
    HighsPostsolveStack& postsolve_stack) {
  for (size_t i = 0; i != singletonRows.size(); ++i) {
    HighsInt row = singletonRows[i];
    if (rowDeleted[row] || rowsize[row] > 1) continue;
    // row presolve will delegate to rowSingleton() if the row size is 1
    // if the singleton row has become empty it will also remove the row
    HPRESOLVE_CHECKED_CALL(rowPresolve(postsolve_stack, row));
  }

  singletonRows.clear();

  return Result::kOk;
}